

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sumFinalize(sqlite3_context *context)

{
  double *pdVar1;
  
  pdVar1 = (double *)sqlite3_aggregate_context(context,0);
  if ((pdVar1 == (double *)0x0) || ((long)pdVar1[2] < 1)) {
    return;
  }
  if (*(char *)(pdVar1 + 3) != '\0') {
    sqlite3_result_error(context,"integer overflow",-1);
    return;
  }
  if (*(char *)((long)pdVar1 + 0x19) != '\0') {
    sqlite3_result_double(context,*pdVar1);
    return;
  }
  sqlite3_result_int64(context,(i64)pdVar1[1]);
  return;
}

Assistant:

static void sumFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    if( p->overflow ){
      sqlite3_result_error(context,"integer overflow",-1);
    }else if( p->approx ){
      sqlite3_result_double(context, p->rSum);
    }else{
      sqlite3_result_int64(context, p->iSum);
    }
  }
}